

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Collision_Elastic_PDU::Collision_Elastic_PDU(Collision_Elastic_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Collision_Elastic_PDU_00223088;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_IssuingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_CollidingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  this->m_ui16Padding1 = 0;
  DATA_TYPE::Vector::Vector(&this->m_ContactVelocity);
  DATA_TYPE::Vector::Vector(&this->m_Location);
  DATA_TYPE::Vector::Vector(&this->m_UnitSurfaceNormal);
  (this->super_Header).super_Header6.m_ui8PDUType = 'B';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui16PDULength = 100;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Collision_Elastic_PDU::Collision_Elastic_PDU() :
    m_ui16Padding1( 0 )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = Collision_Elastic_PDU_Type;
    m_ui16PDULength = COLLISION_ELASTIC_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}